

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

int lzham::lzham_lib_z_deflateInit2
              (lzham_z_streamp pStream,int level,int method,int window_bits,int mem_level,
              int strategy)

{
  long lVar1;
  lzham_compress_state_ptr pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  lzham_compress_state_ptr pComp;
  lzham_compress_params comp_params;
  int max_window_bits;
  int local_1c;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = -2;
  }
  else if ((in_R8D < 1) || (9 < in_R8D)) {
    local_4 = -10000;
  }
  else if ((in_EDX == 8) || (in_EDX == 0xe)) {
    if (in_ESI == -1) {
      in_ESI = 9;
    }
    local_1c = in_ECX;
    if (in_EDX == 8) {
      in_EDX = 0xe;
      local_1c = 0xf;
    }
    lVar1 = (long)local_1c;
    if (lVar1 < 1) {
      lVar1 = -lVar1;
    }
    if (0xe < lVar1) {
      lVar1 = (long)local_1c;
      if (lVar1 < 1) {
        lVar1 = -lVar1;
      }
      if (lVar1 < 0x1e) {
        utils::zero_object<lzham_compress_params>((lzham_compress_params *)0x10d93d);
        *(undefined4 *)(in_RDI + 0x58) = 0;
        *(undefined8 *)(in_RDI + 0x60) = 1;
        *(undefined8 *)(in_RDI + 0x30) = 0;
        *(undefined8 *)(in_RDI + 0x68) = 0;
        *(undefined8 *)(in_RDI + 0x10) = 0;
        *(undefined8 *)(in_RDI + 0x28) = 0;
        pvVar2 = lzham_lib_compress_init((lzham_compress_params *)CONCAT44(in_ESI,in_EDX));
        if (pvVar2 == (lzham_compress_state_ptr)0x0) {
          return -10000;
        }
        *(lzham_compress_state_ptr *)(in_RDI + 0x38) = pvVar2;
        return 0;
      }
    }
    local_4 = -10000;
  }
  else {
    local_4 = -10000;
  }
  return local_4;
}

Assistant:

int lzham_lib_z_deflateInit2(lzham_z_streamp pStream, int level, int method, int window_bits, int mem_level, int strategy)
   {
      LZHAM_NOTE_UNUSED(strategy);

      if (!pStream)
      {
         LZHAM_LOG_ERROR(6029);
         return LZHAM_Z_STREAM_ERROR;
      }
      if ((mem_level < 1) || (mem_level > 9))
      {
         LZHAM_LOG_ERROR(6030);
         return LZHAM_Z_PARAM_ERROR;
      }
      if ((method != LZHAM_Z_DEFLATED) && (method != LZHAM_Z_LZHAM))
      {
         LZHAM_LOG_ERROR(6031);
         return LZHAM_Z_PARAM_ERROR;
      }

      if (level == LZHAM_Z_DEFAULT_COMPRESSION)
         level = 9;

      if (method == LZHAM_Z_DEFLATED)
      {
         // Force Deflate to LZHAM with default window_bits.
         method = LZHAM_Z_LZHAM;
         window_bits = LZHAM_Z_DEFAULT_WINDOW_BITS;
      }

#ifdef LZHAM_Z_API_FORCE_WINDOW_BITS
      window_bits = LZHAM_Z_API_FORCE_WINDOW_BITS;
#endif

      int max_window_bits = LZHAM_64BIT_POINTERS ? LZHAM_MAX_DICT_SIZE_LOG2_X64 : LZHAM_MAX_DICT_SIZE_LOG2_X86;
      if ((labs(window_bits) < LZHAM_MIN_DICT_SIZE_LOG2) || (labs(window_bits) > max_window_bits))
      {
         LZHAM_LOG_ERROR(6032);
         return LZHAM_Z_PARAM_ERROR;
      }

      lzham_compress_params comp_params;

      utils::zero_object(comp_params);
      comp_params.m_struct_size = sizeof(lzham_compress_params);

      comp_params.m_level = LZHAM_COMP_LEVEL_UBER;
      if (level <= 1)
         comp_params.m_level = LZHAM_COMP_LEVEL_FASTEST;
      else if (level <= 3)
         comp_params.m_level = LZHAM_COMP_LEVEL_FASTER;
      else if (level <= 5)
         comp_params.m_level = LZHAM_COMP_LEVEL_DEFAULT;
      else if (level <= 7)
         comp_params.m_level = LZHAM_COMP_LEVEL_BETTER;

      if (level == 10)
         comp_params.m_compress_flags |= LZHAM_COMP_FLAG_EXTREME_PARSING;

      // Use all CPU's. TODO: This is not always the best idea depending on the dictionary size and the # of bytes to compress.
      comp_params.m_max_helper_threads = -1;

      comp_params.m_dict_size_log2 = static_cast<lzham_uint32>(labs(window_bits));

      if (window_bits > 0)
         comp_params.m_compress_flags |= LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM;

      pStream->data_type = 0;
      pStream->adler = LZHAM_Z_ADLER32_INIT;
      pStream->msg = NULL;
      pStream->reserved = 0;
      pStream->total_in = 0;
      pStream->total_out = 0;

      lzham_compress_state_ptr pComp = lzham_lib_compress_init(&comp_params);
      if (!pComp)
      {
         LZHAM_LOG_ERROR(6033);
         return LZHAM_Z_PARAM_ERROR;
      }

      pStream->state = (struct lzham_z_internal_state *)pComp;

      return LZHAM_Z_OK;
   }